

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

Event * ftxui::Event::Special(Event *__return_storage_ptr__,string *input)

{
  __return_storage_ptr__->type_ = Unknown;
  (__return_storage_ptr__->input_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->input_).field_2;
  (__return_storage_ptr__->input_)._M_string_length = 0;
  (__return_storage_ptr__->input_).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->screen_ = (ScreenInteractive *)0x0;
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->input_,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

Event Event::Special(std::string input) {
  Event event;
  event.input_ = std::move(input);
  return event;
}